

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddColumn(Parse *pParse,Token *pName)

{
  Table *pTVar1;
  int iVar2;
  byte *pbVar3;
  Column *pCVar4;
  Parse *in_RDI;
  Column *aNew;
  sqlite3 *db;
  Column *pCol;
  char *z;
  int i;
  Table *p;
  Token *in_stack_ffffffffffffffb8;
  sqlite3 *in_stack_ffffffffffffffc0;
  sqlite3 *db_00;
  int local_1c;
  
  db_00 = in_RDI->db;
  pTVar1 = in_RDI->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    if (db_00->aLimit[2] < pTVar1->nCol + 1) {
      sqlite3ErrorMsg(in_RDI,"too many columns on %s",pTVar1->zName);
    }
    else {
      pbVar3 = (byte *)sqlite3NameFromToken(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (pbVar3 != (byte *)0x0) {
        for (local_1c = 0; local_1c < pTVar1->nCol; local_1c = local_1c + 1) {
          if ((""[*pbVar3] == ""[(byte)*pTVar1->aCol[local_1c].zName]) &&
             (iVar2 = sqlite3_stricmp((char *)(pbVar3 + 1),pTVar1->aCol[local_1c].zName + 1),
             iVar2 == 0)) {
            sqlite3ErrorMsg(in_RDI,"duplicate column name: %s",pbVar3);
            sqlite3DbFree(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            return;
          }
        }
        if ((pTVar1->nCol & 7U) == 0) {
          pCVar4 = (Column *)
                   sqlite3DbRealloc(db_00,in_stack_ffffffffffffffc0,(u64)in_stack_ffffffffffffffb8);
          if (pCVar4 == (Column *)0x0) {
            sqlite3DbFree((sqlite3 *)0x0,in_stack_ffffffffffffffb8);
            return;
          }
          pTVar1->aCol = pCVar4;
        }
        pCVar4 = pTVar1->aCol + pTVar1->nCol;
        memset(pCVar4,0,0x30);
        pCVar4->zName = (char *)pbVar3;
        pCVar4->affinity = 'A';
        pCVar4->szEst = '\x01';
        pTVar1->nCol = pTVar1->nCol + 1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName){
  Table *p;
  int i;
  char *z;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
#if SQLITE_MAX_COLUMN
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
#endif
  z = sqlite3NameFromToken(db, pName);
  if( z==0 ) return;
  for(i=0; i<p->nCol; i++){
    if( STRICMP(z, p->aCol[i].zName) ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
 
  /* If there is no type specified, columns have the default affinity
  ** 'NONE'. If there is a type specified, then sqlite3AddColumnType() will
  ** be called next to set pCol->affinity correctly.
  */
  pCol->affinity = SQLITE_AFF_NONE;
  pCol->szEst = 1;
  p->nCol++;
}